

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

wchar_t blow_index(char *name)

{
  wchar_t wVar1;
  ulong uVar2;
  long lVar3;
  
  if (1 < z_info->blow_effects_max) {
    uVar2 = 1;
    lVar3 = 0x38;
    do {
      wVar1 = my_stricmp(name,*(char **)((long)&blow_effects->name + lVar3));
      if (wVar1 == L'\0') {
        return (wchar_t)uVar2;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x38;
    } while (uVar2 < z_info->blow_effects_max);
  }
  return L'\0';
}

Assistant:

int blow_index(const char *name)
{
	int i;

	for (i = 1; i < z_info->blow_effects_max; i++) {
		struct blow_effect *effect = &blow_effects[i];
		if (my_stricmp(name, effect->name) == 0)
			return i;
	}
	return 0;
}